

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int inflate_gzip_block(BGZF *fp,int cached)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  uint have;
  int ret;
  int cached_local;
  BGZF *fp_local;
  
  have = cached;
  do {
    if ((have == 0) && (fp->gz_stream->avail_out != 0)) {
      sVar3 = hread(fp->fp,fp->compressed_block,0xff00);
      fp->gz_stream->avail_in = (uInt)sVar3;
      if (fp->gz_stream->avail_in == 0) {
        return fp->gz_stream->avail_in;
      }
      if (fp->gz_stream->avail_in == 0) break;
      fp->gz_stream->next_in = (Bytef *)fp->compressed_block;
    }
    else {
      have = 0;
    }
    do {
      fp->gz_stream->next_out = (Bytef *)((long)fp->uncompressed_block + (long)fp->block_offset);
      fp->gz_stream->avail_out = 0x10000 - fp->block_offset;
      iVar1 = inflate(fp->gz_stream,0);
      if (iVar1 != -5) {
        if (iVar1 < 0) {
          return -1;
        }
        iVar2 = 0x10000 - fp->gz_stream->avail_out;
        if (iVar2 != 0) {
          return iVar2;
        }
      }
    } while (fp->gz_stream->avail_out == 0);
  } while (iVar1 != 1);
  return 0x10000 - fp->gz_stream->avail_out;
}

Assistant:

static int inflate_gzip_block(BGZF *fp, int cached)
{
    int ret = Z_OK;
    do
    {
        if ( !cached && fp->gz_stream->avail_out!=0 )
        {
            fp->gz_stream->avail_in = hread(fp->fp, fp->compressed_block, BGZF_BLOCK_SIZE);
            if ( fp->gz_stream->avail_in<=0 ) return fp->gz_stream->avail_in;
            if ( fp->gz_stream->avail_in==0 ) break;
            fp->gz_stream->next_in = fp->compressed_block;
        }
        else cached = 0;
        do
        {
            fp->gz_stream->next_out = (Bytef*)fp->uncompressed_block + fp->block_offset;
            fp->gz_stream->avail_out = BGZF_MAX_BLOCK_SIZE - fp->block_offset;
            ret = inflate(fp->gz_stream, Z_NO_FLUSH);
            if ( ret==Z_BUF_ERROR ) continue;   // non-critical error
            if ( ret<0 ) return -1;
            unsigned int have = BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
            if ( have ) return have;
        }
        while ( fp->gz_stream->avail_out == 0 );
    }
    while (ret != Z_STREAM_END);
    return BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
}